

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall SerialExecutionQueue::~SerialExecutionQueue(SerialExecutionQueue *this)

{
  SerialQueueImpl *this_00;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  (this->super_ExecutionQueue)._vptr_ExecutionQueue =
       (_func_int **)&PTR__SerialExecutionQueue_00203be8;
  this_00 = this->queue;
  if (this_00 != (SerialQueueImpl *)0x0) {
    anon_unknown.dwarf_2f6875::SerialQueueImpl::~SerialQueueImpl(this_00);
  }
  operator_delete(this_00,0xb0);
  this->queue = (SerialQueueImpl *)0x0;
  std::mutex::lock(&this->killAfterTimeoutThreadMutex);
  if ((this->killAfterTimeoutThread)._M_t.
      super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
      super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
    std::unique_lock<std::mutex>::unique_lock(&local_30,&this->queueCompleteMutex);
    this->queueComplete = true;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    std::thread::join();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->killAfterTimeoutThreadMutex);
  std::condition_variable::~condition_variable(&this->queueCompleteCondition);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (&this->killAfterTimeoutThread);
  llbuild::basic::ProcessGroup::~ProcessGroup(&this->spawnedProcesses);
  llbuild::basic::ExecutionQueue::~ExecutionQueue(&this->super_ExecutionQueue);
  return;
}

Assistant:

virtual ~SerialExecutionQueue()
  {
    delete queue;
    queue = nullptr;

    std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
    if (killAfterTimeoutThread) {
      {
        std::unique_lock<std::mutex> lock(queueCompleteMutex);
        queueComplete = true;
        queueCompleteCondition.notify_all();
      }
      killAfterTimeoutThread->join();
    }
  }